

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::setDomainChangeStack
          (HighsDomain *this,
          vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *domchgstack,
          vector<int,_std::allocator<int>_> *branchingPositions)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  pointer pHVar7;
  pointer pHVar8;
  pointer piVar9;
  pointer ppVar10;
  pointer pRVar11;
  int *piVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  bool bVar15;
  byte bVar16;
  int iVar17;
  ulong uVar18;
  pointer piVar19;
  iterator __begin2;
  pointer pHVar20;
  pointer piVar21;
  int *piVar22;
  int iVar23;
  HighsDomainChange boundchg;
  HighsDomainChange boundchg_00;
  HighsDomainChange boundchg_01;
  int local_48;
  
  this->infeasible_ = false;
  pHVar7 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar8 = (this->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pHVar7 != pHVar8) {
    piVar19 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar9 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar20 = pHVar7;
    do {
      piVar21 = piVar9;
      if (pHVar20->boundtype == kLower) {
        piVar21 = piVar19;
      }
      piVar21[pHVar20->column] = -1;
      pHVar20 = pHVar20 + 1;
    } while (pHVar20 != pHVar8);
  }
  ppVar10 = (this->prevboundval_).
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->prevboundval_).
      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar10) {
    (this->prevboundval_).
    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar10;
  }
  if (pHVar7 != pHVar8) {
    (this->domchgstack_).super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
    _M_impl.super__Vector_impl_data._M_finish = pHVar7;
  }
  pRVar11 = (this->domchgreason_).
            super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->domchgreason_).
      super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
      super__Vector_impl_data._M_finish != pRVar11) {
    (this->domchgreason_).
    super__Vector_base<HighsDomain::Reason,_std::allocator<HighsDomain::Reason>_>._M_impl.
    super__Vector_impl_data._M_finish = pRVar11;
  }
  piVar19 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar19) {
    (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = piVar19;
  }
  piVar22 = (branchingPositions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  piVar12 = (branchingPositions->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar17 = 0;
  local_48 = (int)((ulong)((long)(domchgstack->
                                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(domchgstack->
                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 4);
  for (; piVar22 != piVar12; piVar22 = piVar22 + 1) {
    iVar4 = *piVar22;
    iVar23 = iVar4 - iVar17;
    if (iVar23 != 0 && iVar17 <= iVar4) {
      uVar18 = (long)iVar17 << 4 | 0xc;
      do {
        pHVar7 = (domchgstack->
                 super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar17 = *(int *)((long)&pHVar7->boundval + uVar18);
        dVar2 = *(double *)((long)pHVar7 + (uVar18 - 0xc));
        if (iVar17 == 1) {
          if (dVar2 < (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start[*(int *)((long)pHVar7 + (uVar18 - 4))])
          goto LAB_00295aa1;
        }
        else if ((iVar17 != 0) ||
                ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[*(int *)((long)pHVar7 + (uVar18 - 4))] < dVar2)) {
LAB_00295aa1:
          boundchg._8_8_ = *(undefined8 *)((long)pHVar7 + (uVar18 - 4));
          boundchg.boundval = dVar2;
          changeBound(this,boundchg,(Reason)0xfffffffe);
          bVar16 = this->infeasible_;
          if ((bool)bVar16 == false) {
            propagate(this);
            bVar16 = this->infeasible_;
          }
          if ((bVar16 & 1) != 0) {
            return;
          }
        }
        uVar18 = uVar18 + 0x10;
        iVar23 = iVar23 + -1;
        iVar17 = iVar4;
      } while (iVar23 != 0);
    }
    if (iVar17 == local_48) {
      return;
    }
    pHVar7 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dVar2 = pHVar7[iVar17].boundval;
    iVar4 = pHVar7[iVar17].column;
    if (pHVar7[iVar17].boundtype == kLower) {
      dVar3 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4];
      if (dVar2 <= dVar3) {
        if (dVar3 <= dVar2) {
          piVar19 = (this->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_00295b39;
        }
        goto LAB_00295b77;
      }
LAB_00295b3f:
      uVar5 = pHVar7[iVar17].column;
      uVar13 = pHVar7[iVar17].boundtype;
      boundchg_00.boundtype = uVar13;
      boundchg_00.column = uVar5;
      boundchg_00.boundval = dVar2;
      changeBound(this,boundchg_00,(Reason)0xffffffff);
      if (this->infeasible_ != false) {
        return;
      }
      propagate(this);
      if ((this->infeasible_ & 1U) != 0) {
        return;
      }
    }
    else {
      pdVar1 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar4;
      bVar15 = dVar2 < *pdVar1;
      if (bVar15) goto LAB_00295b3f;
      if (bVar15 || dVar2 == *pdVar1) {
        piVar19 = (this->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
LAB_00295b39:
        if (piVar19[iVar4] == -1) goto LAB_00295b3f;
      }
    }
LAB_00295b77:
  }
  do {
    if (local_48 <= iVar17) {
      return;
    }
    pHVar7 = (domchgstack->super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dVar2 = pHVar7[iVar17].boundval;
    if (pHVar7[iVar17].boundtype == kUpper) {
      if (dVar2 < (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[pHVar7[iVar17].column]) goto LAB_00295bd2;
    }
    else if ((pHVar7[iVar17].boundtype != kLower) ||
            ((this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[pHVar7[iVar17].column] < dVar2)) {
LAB_00295bd2:
      uVar6 = pHVar7[iVar17].column;
      uVar14 = pHVar7[iVar17].boundtype;
      boundchg_01.boundtype = uVar14;
      boundchg_01.column = uVar6;
      boundchg_01.boundval = dVar2;
      changeBound(this,boundchg_01,(Reason)0xfffffffe);
      if (this->infeasible_ != false) {
        return;
      }
      propagate(this);
      if ((this->infeasible_ & 1U) != 0) {
        return;
      }
    }
    iVar17 = iVar17 + 1;
  } while( true );
}

Assistant:

void HighsDomain::setDomainChangeStack(
    const std::vector<HighsDomainChange>& domchgstack,
    const std::vector<HighsInt>& branchingPositions) {
  infeasible_ = false;
  mipsolver->mipdata_->debugSolution.resetDomain(*this);

  if (!domchgstack_.empty()) {
    for (const HighsDomainChange& domchg : domchgstack_) {
      if (domchg.boundtype == HighsBoundType::kLower)
        colLowerPos_[domchg.column] = -1;
      else
        colUpperPos_[domchg.column] = -1;
    }
  }

  prevboundval_.clear();
  domchgstack_.clear();
  domchgreason_.clear();
  branchPos_.clear();
  HighsInt stacksize = domchgstack.size();
  HighsInt k = 0;
  for (HighsInt branchPos : branchingPositions) {
    for (; k < branchPos; ++k) {
      if (domchgstack[k].boundtype == HighsBoundType::kLower &&
          domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
        continue;
      if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
          domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
        continue;

      changeBound(domchgstack[k], Reason::unspecified());
      if (!infeasible_) propagate();
      if (infeasible_) return;
    }

    if (k == stacksize) return;

    // For redundant branching bound changes we need to be more careful due to
    // symmetry handling. If these bound changes are redundant simply because
    // the corresponding subtree was enumerated and hence the global bound
    // updated, then we still need to keep their status as branching variables
    // for computing correct stabilizers. They can, however, be safely dropped
    // if they are either strictly redundant in the global domain, or if there
    // is already a local bound change that makes the branching change
    // redundant.
    if (domchgstack[k].boundtype == HighsBoundType::kLower) {
      if (domchgstack[k].boundval <= col_lower_[domchgstack[k].column]) {
        if (domchgstack[k].boundval < col_lower_[domchgstack[k].column])
          continue;
        if (colLowerPos_[domchgstack[k].column] != -1) continue;
      }
    } else {
      if (domchgstack[k].boundval >= col_upper_[domchgstack[k].column]) {
        if (domchgstack[k].boundval > col_upper_[domchgstack[k].column])
          continue;
        if (colUpperPos_[domchgstack[k].column] != -1) continue;
      }
    }

    changeBound(domchgstack[k], Reason::branching());
    if (!infeasible_) propagate();
    if (infeasible_) return;
  }

  for (; k < stacksize; ++k) {
    if (domchgstack[k].boundtype == HighsBoundType::kLower &&
        domchgstack[k].boundval <= col_lower_[domchgstack[k].column])
      continue;
    if (domchgstack[k].boundtype == HighsBoundType::kUpper &&
        domchgstack[k].boundval >= col_upper_[domchgstack[k].column])
      continue;

    mipsolver->mipdata_->debugSolution.boundChangeAdded(*this, domchgstack[k],
                                                        true);

    changeBound(domchgstack[k], Reason::unspecified());
    if (!infeasible_) propagate();
    if (infeasible_) break;
  }
}